

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O1

uchar * convert_image_to_DXT5(uchar *uncompressed,int width,int height,int channels,int *out_size)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  int iVar7;
  int iVar8;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  uchar cblock [8];
  uchar ublock [64];
  undefined8 local_108;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  uchar *local_c0;
  undefined8 local_b8;
  ulong local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  ulong local_88;
  long local_80;
  uchar local_78 [72];
  
  local_b8 = CONCAT44(in_register_00000034,width);
  local_c8 = CONCAT44(in_register_00000014,height);
  *out_size = 0;
  if (channels - 5U < 0xfffffffc || (uncompressed == (uchar *)0x0 || (height < 1 || width < 1))) {
    local_c0 = (uchar *)0x0;
  }
  else {
    bVar1 = 2 < channels;
    uVar12 = (ulong)bVar1;
    bVar2 = (byte)channels & 1;
    uVar10 = (width * 4 + 0xcU & 0xfffffff0) * (height + 3U >> 2);
    *out_size = uVar10;
    local_c0 = (uchar *)malloc((ulong)uVar10);
    uVar9 = 0;
    uVar10 = channels * (int)local_b8;
    local_88 = (ulong)uVar10;
    local_100 = uVar10 * 4;
    local_f4 = channels * 4;
    local_ec = (uint)bVar1 + (uint)bVar1;
    local_a8 = 0;
    local_b0 = 0;
    local_e4 = channels;
    do {
      iVar15 = (int)local_c8 - (int)local_a8;
      if ((int)local_a8 + 4 < (int)local_c8) {
        iVar15 = 4;
      }
      local_80 = (long)iVar15;
      local_dc = -1;
      local_e0 = 4;
      local_90 = 0;
      local_fc = local_e4;
      local_f8 = local_ec;
      local_a0 = uVar12;
      local_98 = uVar9;
      do {
        iVar7 = (int)local_b8;
        iVar4 = local_e0;
        if (iVar7 < local_e0) {
          iVar4 = iVar7;
        }
        iVar3 = (int)local_90;
        local_90 = local_90 + 4;
        iVar3 = iVar7 - iVar3;
        if ((int)local_90 < iVar7) {
          iVar3 = 4;
        }
        local_e8 = (int)uVar12;
        local_f0 = (int)uVar9;
        if (iVar15 < 1) {
          iVar4 = 0;
        }
        else {
          local_d8 = iVar4 + local_dc;
          lVar11 = 0;
          iVar4 = 0;
          iVar7 = local_ec;
          iVar13 = local_e4;
          do {
            local_d0 = iVar7;
            local_cc = (int)uVar12;
            iVar7 = (int)uVar9;
            if (0 < iVar3) {
              lVar16 = (long)iVar4;
              lVar14 = 0;
              iVar5 = iVar13;
              iVar8 = local_d0;
              do {
                local_78[lVar14 * 4 + lVar16] = uncompressed[(int)uVar9];
                local_78[lVar14 * 4 + lVar16 + 1] = uncompressed[(int)uVar12];
                local_78[lVar14 * 4 + lVar16 + 2] = uncompressed[iVar8];
                local_78[lVar14 * 4 + lVar16 + 3] =
                     uncompressed[(long)iVar5 + -1] * (bVar2 ^ 1) - bVar2;
                lVar14 = lVar14 + 1;
                uVar9 = (ulong)(uint)((int)uVar9 + channels);
                iVar8 = iVar8 + channels;
                uVar12 = (ulong)(uint)((int)uVar12 + channels);
                iVar5 = iVar5 + channels;
                iVar4 = iVar4 + 4;
              } while (lVar14 < iVar3);
            }
            if (iVar3 < 4) {
              puVar6 = local_78 + (long)iVar4 + 3;
              iVar5 = local_d8;
              do {
                puVar6[-3] = local_78[0];
                puVar6[-2] = local_78[1];
                puVar6[-1] = local_78[2];
                *puVar6 = local_78[3];
                puVar6 = puVar6 + 4;
                iVar4 = iVar4 + 4;
                iVar5 = iVar5 + 1;
              } while (iVar5 < 3);
            }
            lVar11 = lVar11 + 1;
            iVar5 = (int)local_88;
            uVar9 = (ulong)(uint)(iVar7 + iVar5);
            uVar12 = (ulong)(uint)(local_cc + iVar5);
            iVar13 = iVar13 + iVar5;
            iVar7 = local_d0 + iVar5;
            local_d4 = iVar3;
          } while (lVar11 < local_80);
        }
        iVar7 = iVar15;
        if (iVar15 < 4) {
          do {
            lVar11 = (long)iVar4;
            lVar14 = 0;
            do {
              local_78[lVar14 + lVar11] = local_78[0];
              local_78[lVar14 + lVar11 + 1] = local_78[1];
              local_78[lVar14 + lVar11 + 2] = local_78[2];
              local_78[lVar14 + lVar11 + 3] = local_78[3];
              lVar14 = lVar14 + 4;
            } while ((int)lVar14 != 0x10);
            iVar4 = iVar4 + 0x10;
            bVar1 = iVar7 < 3;
            iVar7 = iVar7 + 1;
          } while (bVar1);
        }
        compress_DDS_alpha_block(local_78,(uchar *)&local_108);
        puVar6 = local_c0;
        iVar4 = (int)local_b0;
        *(undefined8 *)(local_c0 + iVar4) = local_108;
        compress_DDS_color_block(4,local_78,(uchar *)&local_108);
        *(undefined8 *)(puVar6 + (iVar4 + 8)) = local_108;
        local_b0 = (ulong)(iVar4 + 0x10);
        uVar9 = (ulong)(uint)(local_f0 + local_f4);
        local_ec = local_ec + local_f4;
        uVar12 = (ulong)(uint)(local_e8 + local_f4);
        local_e4 = local_e4 + local_f4;
        local_e0 = local_e0 + 4;
        local_dc = local_dc + -4;
      } while ((int)local_90 < (int)local_b8);
      local_a8 = local_a8 + 4;
      uVar9 = (ulong)(uint)((int)local_98 + local_100);
      local_ec = local_f8 + local_100;
      uVar12 = (ulong)(uint)((int)local_a0 + local_100);
      local_e4 = local_fc + local_100;
    } while ((int)local_a8 < (int)local_c8);
  }
  return local_c0;
}

Assistant:

unsigned char* convert_image_to_DXT5(
		const unsigned char *const uncompressed,
		int width, int height, int channels,
		int *out_size )
{
	unsigned char *compressed;
	int i, j, x, y;
	unsigned char ublock[16*4];
	unsigned char cblock[8];
	int index = 0, chan_step = 1;
	int block_count = 0, has_alpha;
	/*	error check	*/
	*out_size = 0;
	if( (width < 1) || (height < 1) ||
		(NULL == uncompressed) ||
		(channels < 1) || ( channels > 4) )
	{
		return NULL;
	}
	/*	for channels == 1 or 2, I do not step forward for R,G,B vales	*/
	if( channels < 3 )
	{
		chan_step = 0;
	}
	/*	# channels = 1 or 3 have no alpha, 2 & 4 do have alpha	*/
	has_alpha = 1 - (channels & 1);
	/*	get the RAM for the compressed image
		(16 bytes per 4x4 pixel block)	*/
	*out_size = ((width+3) >> 2) * ((height+3) >> 2) * 16;
	compressed = (unsigned char*)malloc( *out_size );
	/*	go through each block	*/
	for( j = 0; j < height; j += 4 )
	{
		for( i = 0; i < width; i += 4 )
		{
			/*	local variables, and my block counter	*/
			int idx = 0;
			int mx = 4, my = 4;
			if( j+4 >= height )
			{
				my = height - j;
			}
			if( i+4 >= width )
			{
				mx = width - i;
			}
			for( y = 0; y < my; ++y )
			{
				for( x = 0; x < mx; ++x )
				{
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step+chan_step];
					ublock[idx++] =
						has_alpha * uncompressed[(j+y)*width*channels+(i+x)*channels+channels-1]
						+ (1-has_alpha)*255;
				}
				for( x = mx; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
					ublock[idx++] = ublock[3];
				}
			}
			for( y = my; y < 4; ++y )
			{
				for( x = 0; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
					ublock[idx++] = ublock[3];
				}
			}
			/*	now compress the alpha block	*/
			compress_DDS_alpha_block( ublock, cblock );
			/*	copy the data from the compressed alpha block into the main buffer	*/
			for( x = 0; x < 8; ++x )
			{
				compressed[index++] = cblock[x];
			}
			/*	then compress the color block	*/
			++block_count;
			compress_DDS_color_block( 4, ublock, cblock );
			/*	copy the data from the compressed color block into the main buffer	*/
			for( x = 0; x < 8; ++x )
			{
				compressed[index++] = cblock[x];
			}
		}
	}
	return compressed;
}